

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

double __thiscall re2::trunc_abi_cxx11_(re2 *this,double __x)

{
  size_type sVar1;
  StringPiece *in_RSI;
  double extraout_XMM0_Qa;
  double dVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  StringPiece *in_stack_ffffffffffffffb0;
  string local_30 [8];
  StringPiece *in_stack_ffffffffffffffd8;
  
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  sVar1 = StringPiece::size(in_RSI);
  if (sVar1 < 100) {
    StringPiece::operator_cast_to_string(in_stack_ffffffffffffffd8);
    dVar2 = extraout_XMM0_Qa;
  }
  else {
    StringPiece::substr(in_stack_ffffffffffffffb0,(size_type)__lhs,(size_type)this);
    StringPiece::operator_cast_to_string(in_stack_ffffffffffffffd8);
    std::operator+(__lhs,(char *)this);
    dVar2 = (double)std::__cxx11::string::~string(local_30);
  }
  return dVar2;
}

Assistant:

static std::string trunc(const StringPiece& pattern) {
  if (pattern.size() < 100)
    return std::string(pattern);
  return std::string(pattern.substr(0, 100)) + "...";
}